

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O1

int __thiscall Saturation::SaturationAlgorithm::init(SaturationAlgorithm *this,EVP_PKEY_CTX *ctx)

{
  Literal **ppLVar1;
  List<Kernel::Unit_*> **ppLVar2;
  List<Kernel::Unit_*> *pLVar3;
  int iVar4;
  void **head;
  undefined1 auVar5 [8];
  ulong uVar6;
  Clause *cl;
  undefined1 local_78 [8];
  List<Kernel::Unit_*> *pLStack_70;
  Unit *local_68;
  Entry *pEStack_60;
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined8 uStack_40;
  Unit *local_38;
  Entry *pEStack_30;
  Unit *local_28;
  List<Kernel::Unit_*> *pLStack_20;
  Unit *local_18;
  
  if (*(char *)(::Lib::env + 0x16b2) == '\x01') {
    local_68 = (Unit *)0x0;
    pEStack_60 = (Entry *)0x0;
    local_78 = (undefined1  [8])0x0;
    pLStack_70 = (List<Kernel::Unit_*> *)0x0;
    Kernel::Problem::clauseIterator((Problem *)local_50);
    ::Lib::Stack<Kernel::Clause*>::loadFromIterator<Lib::VirtualIterator<Kernel::Clause*>>
              ((Stack<Kernel::Clause*> *)local_78,(VirtualIterator<Kernel::Clause_*> *)local_50);
    if (local_50 != (undefined1  [8])0x0) {
      ppLVar1 = (Literal **)((long)local_50 + 8);
      *(int *)ppLVar1 = *(int *)ppLVar1 + -1;
      if (*(int *)ppLVar1 == 0) {
        (**(code **)(*(long *)(anon_union_4_2_6ecd024b_for_Entry_0 *)local_50 + 8))();
      }
    }
    Shell::Shuffling::shuffleArray<Lib::Stack<Kernel::Clause*>>
              ((Stack<Kernel::Clause_*> *)local_78,
               (uint)((ulong)((long)local_68 - (long)pLStack_70) >> 3));
    pEStack_30 = pEStack_60;
    local_38 = local_68;
    uStack_40 = pLStack_70;
    local_48 = local_78;
    local_18 = (Unit *)((long)local_68 - (long)pLStack_70 >> 3);
    local_28 = (Unit *)0x0;
    pLStack_20 = (List<Kernel::Unit_*> *)0x0;
    local_78 = (undefined1  [8])0x0;
    pEStack_60 = (Entry *)0x0;
    pLStack_70 = (List<Kernel::Unit_*> *)0x0;
    local_68 = (Unit *)0x0;
    auVar5 = (undefined1  [8])::operator_new(0x48,8);
    ((UnitList *)((long)auVar5 + 0x40))->_head = local_18;
    ((UnitList *)((long)auVar5 + 0x30))->_head = local_28;
    ((UnitList *)((long)auVar5 + 0x30))->_tail = pLStack_20;
    *(undefined4 *)&((UnitList *)auVar5)->_tail = 0;
    ((UnitList *)auVar5)->_head = (Unit *)&PTR__ProxyIterator_00b61ca8;
    ((UnitList *)((long)auVar5 + 0x10))->_head = (Unit *)0x0;
    ((UnitList *)((long)auVar5 + 0x10))->_tail = (List<Kernel::Unit_*> *)0x0;
    ((UnitList *)((long)auVar5 + 0x20))->_head = (Unit *)0x0;
    ((UnitList *)((long)auVar5 + 0x20))->_tail = (List<Kernel::Unit_*> *)0x0;
    ((UnitList *)((long)auVar5 + 0x10))->_head = (Unit *)local_48;
    ((UnitList *)((long)auVar5 + 0x20))->_tail = (List<Kernel::Unit_*> *)pEStack_30;
    pLVar3 = ((UnitList *)((long)auVar5 + 0x10))->_tail;
    ((UnitList *)((long)auVar5 + 0x10))->_tail = uStack_40;
    ((UnitList *)((long)auVar5 + 0x20))->_head = local_38;
    *(undefined4 *)&((UnitList *)auVar5)->_tail = 1;
    if (pLVar3 != (List<Kernel::Unit_*> *)0x0) {
      pLVar3->_head = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pLVar3;
    }
    *(undefined4 *)&((UnitList *)auVar5)->_tail = 1;
    pEStack_30 = (Entry *)0x0;
    local_38 = (Unit *)0x0;
    uStack_40._0_4_ = 0;
    uStack_40._4_4_ = 0;
    local_48._0_4_ = 0;
    local_48._4_4_ = 0;
    if (pLStack_70 != (List<Kernel::Unit_*> *)0x0) {
      uVar6 = (long)local_78 * 8 + 0xfU & 0xfffffffffffffff0;
      if (uVar6 == 0) {
        pLStack_70->_head = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pLStack_70;
      }
      else if (uVar6 < 0x11) {
        pLStack_70->_head = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pLStack_70;
      }
      else if (uVar6 < 0x19) {
        pLStack_70->_head = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pLStack_70;
      }
      else if (uVar6 < 0x21) {
        pLStack_70->_head = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pLStack_70;
      }
      else if (uVar6 < 0x31) {
        pLStack_70->_head = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pLStack_70;
      }
      else if (uVar6 < 0x41) {
        pLStack_70->_head = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pLStack_70;
      }
      else {
        operator_delete(pLStack_70,0x10);
      }
    }
  }
  else {
    Kernel::Problem::clauseIterator((Problem *)local_78);
    auVar5 = local_78;
    if (local_78 != (undefined1  [8])0x0) {
      *(int *)((long)local_78 + 8) = *(int *)((long)local_78 + 8) + 1;
      ppLVar2 = (List<Kernel::Unit_*> **)((long)local_78 + 8);
      *(int *)ppLVar2 = *(int *)ppLVar2 + -1;
      if (*(int *)ppLVar2 == 0) {
        (**(code **)&(*(Unit **)local_78)->_inference)();
      }
    }
  }
  while (iVar4 = (**(code **)&(((UnitList *)auVar5)->_head->_inference).field_0x8)(auVar5),
        (char)iVar4 != '\0') {
    cl = (Clause *)(*(code *)(((UnitList *)auVar5)->_head->_inference)._splits)(auVar5);
    addInputClause(this,cl);
  }
  if (this->_splitter != (Splitter *)0x0) {
    iVar4 = Splitter::init(this->_splitter,(EVP_PKEY_CTX *)this);
  }
  if (this->_consFinder != (ConsequenceFinder *)0x0) {
    iVar4 = ConsequenceFinder::init(this->_consFinder,(EVP_PKEY_CTX *)this);
  }
  if (this->_symEl != (SymElOutput *)0x0) {
    iVar4 = SymElOutput::init(this->_symEl,(EVP_PKEY_CTX *)this);
  }
  ppLVar2 = &((UnitList *)auVar5)->_tail;
  *(int *)ppLVar2 = *(int *)ppLVar2 + -1;
  if (*(int *)ppLVar2 == 0) {
    iVar4 = (**(code **)&((UnitList *)auVar5)->_head->_inference)(auVar5);
  }
  return iVar4;
}

Assistant:

void SaturationAlgorithm::init()
{
  ClauseIterator toAdd;

  if (env.options->randomTraversals()) {
    TIME_TRACE(TimeTrace::SHUFFLING);

    Stack<Clause *> aux;
    aux.loadFromIterator(_prb.clauseIterator());
    Shuffling::shuffleArray(aux,aux.size());
    toAdd = pvi(arrayIter(std::move(aux)));
  } else {
    toAdd = _prb.clauseIterator();
  }

  while (toAdd.hasNext()) {
    Clause* cl = toAdd.next();
    addInputClause(cl);
  }

  if (_splitter) {
    _splitter->init(this);
  }
  if (_consFinder) {
    _consFinder->init(this);
  }
  if (_symEl) {
    _symEl->init(this);
  }
}